

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void OpenSimpleHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  char *pcVar1;
  ostream *poVar2;
  mapped_type this;
  mapped_type *ppAVar3;
  long in_RCX;
  undefined4 *in_RDX;
  undefined8 in_RSI;
  string *in_stack_00000008;
  AnonSimpleFile *in_stack_00000010;
  AnonSimpleFile *f;
  _OpenSimpleResponseMsg open_response_msg;
  Remote_evpath_state *ev_state;
  OpenSimpleFileMsg open_msg;
  key_type *in_stack_ffffffffffffff28;
  mapped_type __args;
  allocator local_81;
  string local_80 [32];
  mapped_type local_60;
  undefined4 local_58 [2];
  int64_t local_50;
  size_t local_48;
  long local_38;
  undefined4 *local_30;
  undefined8 local_10;
  
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_10 = in_RSI;
  poVar2 = std::operator<<((ostream *)&std::cout,"Got an open simple request for file ");
  poVar2 = std::operator<<(poVar2,*(char **)(local_30 + 2));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this = (mapped_type)operator_new(0x50);
  pcVar1 = *(char **)(local_30 + 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar1,&local_81);
  AnonSimpleFile::AnonSimpleFile(in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_60 = this;
  std::__cxx11::string::operator=((string *)&this->m_FileName,*(char **)(local_30 + 2));
  memset(local_58,0,0x20);
  local_50 = local_60->m_ID;
  local_48 = local_60->m_Size;
  local_58[0] = *local_30;
  CMwrite(local_10,*(undefined8 *)(local_38 + 0x20),local_58);
  CMconn_register_close_handler(local_10,ConnCloseHandler,0);
  __args = local_60;
  ppAVar3 = std::
            unordered_map<unsigned_long,_AnonSimpleFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>_>
            ::operator[]((unordered_map<unsigned_long,_AnonSimpleFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>_>
                          *)local_60,in_stack_ffffffffffffff28);
  *ppAVar3 = __args;
  std::
  unordered_multimap<void*,unsigned_long,std::hash<void*>,std::equal_to<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
  ::emplace<_CMConnection*&,long&>
            ((unordered_multimap<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)this,(_CMConnection **)__args,(long *)in_stack_ffffffffffffff28);
  SimpleFilesOpened = SimpleFilesOpened + 1;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  return;
}

Assistant:

static void OpenSimpleHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                              attr_list attrs)
{
    OpenSimpleFileMsg open_msg = static_cast<OpenSimpleFileMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _OpenSimpleResponseMsg open_response_msg;
    std::cout << "Got an open simple request for file " << open_msg->FileName << std::endl;
    AnonSimpleFile *f = new AnonSimpleFile(open_msg->FileName);
    f->m_FileName = open_msg->FileName;
    memset(&open_response_msg, 0, sizeof(open_response_msg));
    open_response_msg.FileHandle = f->m_ID;
    open_response_msg.FileSize = f->m_Size;
    open_response_msg.OpenResponseCondition = open_msg->OpenResponseCondition;

    CMwrite(conn, ev_state->OpenSimpleResponseFormat, &open_response_msg);
    CMconn_register_close_handler(conn, ConnCloseHandler, NULL);
    SimpleFileMap[f->m_ID] = f;
    ConnToFileMap.emplace(conn, f->m_ID);
    SimpleFilesOpened++;
    last_service_time = std::chrono::steady_clock::now();
}